

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void RAWToUVJRow_C(uint8_t *src_rgb0,int src_stride_rgb,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  uint uVar6;
  
  lVar4 = (long)src_stride_rgb;
  if (1 < width) {
    iVar3 = 0;
    do {
      uVar1 = ((uint)src_rgb0[5] + (uint)src_rgb0[lVar4 + 5] + 1 >> 1 & 0xff) +
              ((uint)src_rgb0[2] + (uint)src_rgb0[lVar4 + 2] + 1 >> 1 & 0xff) + 1 >> 1;
      uVar2 = ((uint)src_rgb0[1] + (uint)src_rgb0[lVar4 + 1] + 1 >> 1 & 0xff) +
              ((uint)src_rgb0[4] + (uint)src_rgb0[lVar4 + 4] + 1 >> 1 & 0xff) + 1 >> 1;
      uVar6 = ((uint)src_rgb0[3] + (uint)src_rgb0[lVar4 + 3] + 1 >> 1 & 0xff) +
              ((uint)*src_rgb0 + (uint)src_rgb0[lVar4] + 1 >> 1 & 0xff) + 1 >> 1;
      *dst_u = (uint8_t)(uVar6 * 0xffd5 + 0x8080 + uVar2 * 0xffac + uVar1 * 0x7f >> 8);
      *dst_v = (uint8_t)(uVar6 * 0x7f + 0x8080 + uVar1 * 0xffec + uVar2 * 0xff95 >> 8);
      src_rgb0 = src_rgb0 + 6;
      dst_u = dst_u + 1;
      dst_v = dst_v + 1;
      iVar3 = iVar3 + 2;
    } while (iVar3 < width + -1);
  }
  pbVar5 = src_rgb0 + lVar4;
  if ((width & 1U) != 0) {
    uVar1 = (uint)pbVar5[2] + (uint)src_rgb0[2] + 1 >> 1 & 0xff;
    uVar6 = (uint)src_rgb0[1] + (uint)pbVar5[1] + 1 >> 1 & 0xff;
    uVar2 = (uint)*src_rgb0 + (uint)*pbVar5 + 1 >> 1 & 0xff;
    *dst_u = (uint8_t)(uVar2 * 0xffd5 + 0x8080 + uVar6 * 0xffac + uVar1 * 0x7f >> 8);
    *dst_v = (uint8_t)(uVar2 * 0x7f + 0x8080 + uVar1 * 0xffec + uVar6 * 0xff95 >> 8);
  }
  return;
}

Assistant:

void RGB565ToYRow_C(const uint8_t* src_rgb565, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb565[0] & 0x1f;
    uint8_t g = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r = src_rgb565[1] >> 3;
    b = (b << 3) | (b >> 2);
    g = (g << 2) | (g >> 4);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_rgb565 += 2;
    dst_y += 1;
  }
}